

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer_matrix_uniform.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  long lVar1;
  double *pdVar2;
  istream *piVar3;
  ostream *poVar4;
  allocator local_6d;
  int L;
  string local_68;
  double H;
  double J;
  double local_38;
  double t_step;
  double t_max;
  double t_min;
  double local_18;
  
  if (argc < 7) {
    pdVar2 = (double *)std::istream::operator>>((istream *)&std::cin,&L);
    piVar3 = std::istream::_M_extract<double>(pdVar2);
    piVar3 = std::istream::_M_extract<double>((double *)piVar3);
    piVar3 = std::istream::_M_extract<double>((double *)piVar3);
    piVar3 = std::istream::_M_extract<double>((double *)piVar3);
    std::istream::_M_extract<double>((double *)piVar3);
  }
  else {
    std::__cxx11::string::string((string *)&local_68,argv[1],&local_6d);
    L = std::__cxx11::stoi(&local_68,(size_t *)0x0,10);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::string((string *)&local_68,argv[2],&local_6d);
    J = std::__cxx11::stod(&local_68,(size_t *)0x0);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::string((string *)&local_68,argv[3],&local_6d);
    H = std::__cxx11::stod(&local_68,(size_t *)0x0);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::string((string *)&local_68,argv[4],&local_6d);
    t_min = std::__cxx11::stod(&local_68,(size_t *)0x0);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::string((string *)&local_68,argv[5],&local_6d);
    t_max = std::__cxx11::stod(&local_68,(size_t *)0x0);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::string((string *)&local_68,argv[6],&local_6d);
    t_step = std::__cxx11::stod(&local_68,(size_t *)0x0);
    std::__cxx11::string::~string((string *)&local_68);
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"# L = ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,L);
  poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
  std::operator<<(poVar4,"# J = ");
  poVar4 = std::ostream::_M_insert<double>(J);
  poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
  std::operator<<(poVar4,"# H = ");
  poVar4 = std::ostream::_M_insert<double>(H);
  std::endl<char,std::char_traits<char>>(poVar4);
  lVar1 = std::cout;
  *(uint *)(std::ios_base::Init::Init + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::ios_base::Init::Init + *(long *)(std::cout + -0x18)) & 0xfffffefb | 0x100;
  *(undefined8 *)(strtol + *(long *)(lVar1 + -0x18)) = 0xb;
  for (local_38 = t_min; local_38 <= t_max; local_38 = local_38 + t_step) {
    local_18 = ising::square::transfer_matrix::free_energy_density(1.0 / local_38,L,L,J,H);
    poVar4 = std::ostream::_M_insert<double>(local_38);
    std::operator<<(poVar4,' ');
    poVar4 = std::ostream::_M_insert<double>(local_18);
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  return 0;
}

Assistant:

int main(int argc, char **argv) {
  int L; // system size
  double J, H;
  double t_min, t_max, t_step;
  if (argc >=7) {
    L = std::stoi(argv[1]);
    J = std::stod(argv[2]);
    H = std::stod(argv[3]);
    t_min = std::stod(argv[4]);
    t_max = std::stod(argv[5]);
    t_step = std::stod(argv[6]);
  } else {
    std::cin >> L >> J >> H >> t_min >> t_max >> t_step;
  }
  std::cout << "# L = " << L << std::endl
            << "# J = " << J << std::endl
            << "# H = " << H << std::endl;
  std::cout << std::scientific << std::setprecision(11);
  for (double t = t_min; t <= t_max; t += t_step) {
    double beta = 1 / t;
    double f = ising::square::transfer_matrix::free_energy_density(beta, L, L, J, H);
    std::cout << t << ' ' << f << std::endl;
  }
}